

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

Status __thiscall leveldb::VersionSet::Recover(VersionSet *this,bool *save_manifest)

{
  long lVar1;
  Env *env;
  ulong uVar2;
  Status SVar3;
  bool bVar4;
  char *__rhs;
  Version *v;
  ulong uVar5;
  undefined1 *in_RDX;
  byte bVar6;
  ulong uVar7;
  byte bVar8;
  VersionSet *this_00;
  byte bVar9;
  byte bVar10;
  long in_FS_OFFSET;
  ulong local_3d8;
  SequenceNumber local_3d0;
  uint64_t local_3c8;
  ulong local_3c0;
  Slice local_3a8;
  Slice local_398;
  Status local_388;
  Slice record;
  LogReporter reporter;
  SequentialFile *file;
  Status s;
  Reader reader;
  undefined1 local_2f8 [32];
  VersionEdit edit;
  string scratch;
  Builder builder;
  string dscname;
  string current;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  current._M_dataplus._M_p = (pointer)&current.field_2;
  current._M_string_length = 0;
  current.field_2._M_local_buf[0] = '\0';
  env = *(Env **)save_manifest;
  CurrentFileName((string *)&builder,(string *)(save_manifest + 8));
  ReadFileToString((leveldb *)&s,env,(string *)&builder,&current);
  std::__cxx11::string::~string((string *)&builder);
  if (s.state_ != (char *)0x0) {
    this->env_ = (Env *)s.state_;
    s.state_ = (char *)0x0;
    goto LAB_00a4e2e1;
  }
  if ((current._M_string_length == 0) ||
     (current._M_dataplus._M_p[current._M_string_length - 1] != '\n')) {
    builder.vset_ = (VersionSet *)anon_var_dwarf_391dee3;
    builder.base_ = (Version *)0x26;
    edit.comparator_._M_dataplus._M_p = "";
    edit.comparator_._M_string_length = 0;
    Status::Corruption((Status *)this,(Slice *)&builder,(Slice *)&edit);
    goto LAB_00a4e2e1;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (&current,current._M_string_length - 1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&builder,
                 (string *)(save_manifest + 8),"/");
  std::operator+(&dscname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &builder,&current);
  std::__cxx11::string::~string((string *)&builder);
  (**(code **)(**(long **)save_manifest + 0x10))(&builder,*(long **)save_manifest,&dscname,&file);
  SVar3 = s;
  s.state_ = (char *)builder.vset_;
  builder.vset_ = (VersionSet *)SVar3.state_;
  Status::~Status((Status *)&builder);
  if (s.state_ == (char *)0x0) {
    Builder::Builder(&builder,(VersionSet *)save_manifest,*(Version **)(save_manifest + 0x168));
    reporter.super_Reporter._vptr_Reporter = (_func_int **)&PTR__Reporter_01156750;
    reporter.status = &s;
    log::Reader::Reader(&reader,file,&reporter.super_Reporter,true,0);
    record.data_ = "";
    record.size_ = 0;
    scratch._M_dataplus._M_p = (pointer)&scratch.field_2;
    scratch._M_string_length = 0;
    scratch.field_2._M_local_buf[0] = '\0';
    bVar6 = 0;
    bVar8 = 0;
    bVar10 = 0;
    bVar9 = 0;
    local_3c8 = 0;
    local_3d0 = 0;
    local_3d8 = 0;
    local_3c0 = 0;
    while( true ) {
      bVar4 = log::Reader::ReadRecord(&reader,&record,&scratch);
      if (!bVar4 || s.state_ != (char *)0x0) break;
      VersionEdit::VersionEdit(&edit);
      VersionEdit::DecodeFrom((VersionEdit *)local_2f8,(Slice *)&edit);
      SVar3 = s;
      s.state_ = (char *)local_2f8._0_8_;
      local_2f8._0_8_ = SVar3.state_;
      Status::~Status((Status *)local_2f8);
      if (s.state_ == (char *)0x0) {
        if (edit.has_comparator_ == true) {
          __rhs = (char *)(**(code **)(**(long **)(save_manifest + 0x40) + 0x18))();
          bVar4 = std::operator==(&edit.comparator_,__rhs);
          if (!bVar4) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2f8,&edit.comparator_," does not match existing comparator ");
            local_398.data_._0_4_ = local_2f8._0_4_;
            local_398.data_._4_4_ = local_2f8._4_4_;
            local_398.size_._0_4_ = local_2f8._8_4_;
            local_398.size_._4_4_ = local_2f8._12_4_;
            local_3a8.data_ = (char *)(**(code **)(**(long **)(save_manifest + 0x40) + 0x18))();
            local_3a8.size_ = strlen(local_3a8.data_);
            Status::InvalidArgument(&local_388,&local_398,&local_3a8);
            SVar3 = s;
            s.state_ = local_388.state_;
            local_388.state_ = SVar3.state_;
            Status::~Status(&local_388);
            std::__cxx11::string::~string((string *)local_2f8);
          }
          if (s.state_ != (char *)0x0) goto LAB_00a4dfc9;
        }
        Builder::Apply(&builder,&edit);
      }
LAB_00a4dfc9:
      if (edit.has_log_number_ != false) {
        local_3d8 = edit.log_number_;
      }
      if (edit.has_prev_log_number_ != false) {
        local_3c0 = edit.prev_log_number_;
      }
      if (edit.has_next_file_number_ != false) {
        local_3c8 = edit.next_file_number_;
      }
      if (edit.has_last_sequence_ != false) {
        local_3d0 = edit.last_sequence_;
      }
      bVar6 = bVar6 | edit.has_log_number_;
      bVar8 = bVar8 | edit.has_prev_log_number_;
      bVar10 = bVar10 | edit.has_next_file_number_;
      bVar9 = bVar9 | edit.has_last_sequence_;
      VersionEdit::~VersionEdit(&edit);
    }
    std::__cxx11::string::~string((string *)&scratch);
    log::Reader::~Reader(&reader);
    log::Reader::Reporter::~Reporter(&reporter.super_Reporter);
    if (file != (SequentialFile *)0x0) {
      (*file->_vptr_SequentialFile[1])();
    }
    file = (SequentialFile *)0x0;
    if (s.state_ == (char *)0x0) {
      if ((bVar10 & 1) == 0) {
        edit.comparator_._M_dataplus._M_p = "no meta-nextfile entry in descriptor";
        edit.comparator_._M_string_length = 0x24;
        reader.file_ = (SequentialFile *)0xc7f1cc;
        reader.reporter_ = (Reporter *)0x0;
        Status::Corruption((Status *)&scratch,(Slice *)&edit,(Slice *)&reader);
LAB_00a4e17d:
        SVar3.state_ = s.state_;
        s.state_ = scratch._M_dataplus._M_p;
        scratch._M_dataplus._M_p = SVar3.state_;
        Status::~Status((Status *)&scratch);
      }
      else {
        if ((bVar6 & 1) == 0) {
          edit.comparator_._M_dataplus._M_p = "no meta-lognumber entry in descriptor";
          edit.comparator_._M_string_length = 0x25;
          reader.file_ = (SequentialFile *)0xc7f1cc;
          reader.reporter_ = (Reporter *)0x0;
          Status::Corruption((Status *)&scratch,(Slice *)&edit,(Slice *)&reader);
          goto LAB_00a4e17d;
        }
        if ((bVar9 & 1) == 0) {
          edit.comparator_._M_dataplus._M_p = "no last-sequence-number entry in descriptor";
          edit.comparator_._M_string_length = 0x2b;
          reader.file_ = (SequentialFile *)0xc7f1cc;
          reader.reporter_ = (Reporter *)0x0;
          Status::Corruption((Status *)&scratch,(Slice *)&edit,(Slice *)&reader);
          goto LAB_00a4e17d;
        }
      }
      uVar7 = 0;
      if ((bVar8 & 1) != 0) {
        uVar7 = local_3c0;
      }
      uVar5 = *(ulong *)(save_manifest + 0x48);
      uVar2 = uVar7 + 1;
      if ((uVar5 <= uVar7) || (uVar2 = uVar5, uVar5 <= local_3d8)) {
        uVar5 = local_3d8 + 1;
        if (local_3d8 < uVar2) {
          uVar5 = uVar2;
        }
        *(ulong *)(save_manifest + 0x48) = uVar5;
      }
      if (s.state_ == (char *)0x0) {
        v = (Version *)operator_new(0xe8);
        v->vset_ = (VersionSet *)save_manifest;
        v->next_ = v;
        v->prev_ = v;
        v->refs_ = 0;
        memset(v->files_,0,0xb0);
        v->file_to_compact_level_ = -1;
        v->compaction_score_ = -1.0;
        v->compaction_level_ = -1;
        this_00 = (VersionSet *)&builder;
        Builder::SaveTo((Builder *)this_00,v);
        Finalize(this_00,v);
        AppendVersion((VersionSet *)save_manifest,v);
        *(uint64_t *)(save_manifest + 0x50) = local_3c8;
        *(uint64_t *)(save_manifest + 0x48) = local_3c8 + 1;
        *(SequenceNumber *)(save_manifest + 0x58) = local_3d0;
        *(ulong *)(save_manifest + 0x60) = local_3d8;
        *(ulong *)(save_manifest + 0x68) = uVar7;
        bVar4 = ReuseManifest((VersionSet *)save_manifest,&dscname,&current);
        if (!bVar4) {
          *in_RDX = 1;
        }
      }
    }
    this->env_ = (Env *)s.state_;
    s.state_ = (char *)0x0;
    Builder::~Builder(&builder);
  }
  else if (s.state_[4] == '\x01') {
    edit.comparator_._M_dataplus._M_p = "CURRENT points to a non-existent file";
    edit.comparator_._M_string_length = 0x25;
    Status::ToString_abi_cxx11_((string *)&builder,&s);
    reader.file_ = (SequentialFile *)builder.vset_;
    reader.reporter_ = (Reporter *)builder.base_;
    Status::Corruption((Status *)this,(Slice *)&edit,(Slice *)&reader);
    std::__cxx11::string::~string((string *)&builder);
  }
  else {
    this->env_ = (Env *)s.state_;
    s.state_ = (char *)0x0;
  }
  std::__cxx11::string::~string((string *)&dscname);
LAB_00a4e2e1:
  Status::~Status(&s);
  std::__cxx11::string::~string((string *)&current);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (Status)(char *)this;
}

Assistant:

Status VersionSet::Recover(bool* save_manifest) {
  struct LogReporter : public log::Reader::Reporter {
    Status* status;
    void Corruption(size_t bytes, const Status& s) override {
      if (this->status->ok()) *this->status = s;
    }
  };

  // Read "CURRENT" file, which contains a pointer to the current manifest file
  std::string current;
  Status s = ReadFileToString(env_, CurrentFileName(dbname_), &current);
  if (!s.ok()) {
    return s;
  }
  if (current.empty() || current[current.size() - 1] != '\n') {
    return Status::Corruption("CURRENT file does not end with newline");
  }
  current.resize(current.size() - 1);

  std::string dscname = dbname_ + "/" + current;
  SequentialFile* file;
  s = env_->NewSequentialFile(dscname, &file);
  if (!s.ok()) {
    if (s.IsNotFound()) {
      return Status::Corruption("CURRENT points to a non-existent file",
                                s.ToString());
    }
    return s;
  }

  bool have_log_number = false;
  bool have_prev_log_number = false;
  bool have_next_file = false;
  bool have_last_sequence = false;
  uint64_t next_file = 0;
  uint64_t last_sequence = 0;
  uint64_t log_number = 0;
  uint64_t prev_log_number = 0;
  Builder builder(this, current_);

  {
    LogReporter reporter;
    reporter.status = &s;
    log::Reader reader(file, &reporter, true /*checksum*/,
                       0 /*initial_offset*/);
    Slice record;
    std::string scratch;
    while (reader.ReadRecord(&record, &scratch) && s.ok()) {
      VersionEdit edit;
      s = edit.DecodeFrom(record);
      if (s.ok()) {
        if (edit.has_comparator_ &&
            edit.comparator_ != icmp_.user_comparator()->Name()) {
          s = Status::InvalidArgument(
              edit.comparator_ + " does not match existing comparator ",
              icmp_.user_comparator()->Name());
        }
      }

      if (s.ok()) {
        builder.Apply(&edit);
      }

      if (edit.has_log_number_) {
        log_number = edit.log_number_;
        have_log_number = true;
      }

      if (edit.has_prev_log_number_) {
        prev_log_number = edit.prev_log_number_;
        have_prev_log_number = true;
      }

      if (edit.has_next_file_number_) {
        next_file = edit.next_file_number_;
        have_next_file = true;
      }

      if (edit.has_last_sequence_) {
        last_sequence = edit.last_sequence_;
        have_last_sequence = true;
      }
    }
  }
  delete file;
  file = nullptr;

  if (s.ok()) {
    if (!have_next_file) {
      s = Status::Corruption("no meta-nextfile entry in descriptor");
    } else if (!have_log_number) {
      s = Status::Corruption("no meta-lognumber entry in descriptor");
    } else if (!have_last_sequence) {
      s = Status::Corruption("no last-sequence-number entry in descriptor");
    }

    if (!have_prev_log_number) {
      prev_log_number = 0;
    }

    MarkFileNumberUsed(prev_log_number);
    MarkFileNumberUsed(log_number);
  }

  if (s.ok()) {
    Version* v = new Version(this);
    builder.SaveTo(v);
    // Install recovered version
    Finalize(v);
    AppendVersion(v);
    manifest_file_number_ = next_file;
    next_file_number_ = next_file + 1;
    last_sequence_ = last_sequence;
    log_number_ = log_number;
    prev_log_number_ = prev_log_number;

    // See if we can reuse the existing MANIFEST file.
    if (ReuseManifest(dscname, current)) {
      // No need to save new manifest
    } else {
      *save_manifest = true;
    }
  }

  return s;
}